

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O0

void do_db(int *ip)

{
  char cVar1;
  int iVar2;
  ushort *puVar3;
  int iVar4;
  ushort **ppuVar5;
  byte local_11;
  uchar c;
  int *ip_local;
  
  labldef(loccnt,1);
  data_loccnt = loccnt;
  data_level = 2;
  do {
    ppuVar5 = __ctype_b_loc();
    puVar3 = *ppuVar5;
    iVar2 = *ip;
    *ip = iVar2 + 1;
  } while ((puVar3[(int)prlnbuf[iVar2 + 1]] & 0x2000) != 0);
  do {
    if (prlnbuf[*ip] == '\"') {
      while( true ) {
        iVar2 = *ip;
        *ip = iVar2 + 1;
        local_11 = prlnbuf[iVar2 + 1];
        if (local_11 == 0x22) break;
        if (local_11 == 0) {
          error("Unterminated ASCII string!");
          return;
        }
        if (local_11 == 0x5c) {
          iVar2 = *ip;
          *ip = iVar2 + 1;
          local_11 = prlnbuf[(long)iVar2 + 1];
          if (local_11 == 0x6e) {
            local_11 = 10;
          }
          else if (local_11 == 0x72) {
            local_11 = 0xd;
          }
          else if (local_11 == 0x74) {
            local_11 = 9;
          }
        }
        if (pass == 1) {
          putbyte(loccnt,(uint)local_11);
        }
        loccnt = loccnt + 1;
      }
      *ip = *ip + 1;
    }
    else {
      iVar4 = evaluate(ip,'\0');
      iVar2 = loccnt;
      if (iVar4 == 0) {
        return;
      }
      loccnt = loccnt + 1;
      if (pass == 1) {
        if ((0xff < value) && (value < 0xffffff80)) {
          error("Overflow error!");
          return;
        }
        putbyte(iVar2,value);
      }
    }
    iVar2 = *ip;
    *ip = iVar2 + 1;
    cVar1 = prlnbuf[iVar2];
    if (cVar1 != ',') {
      if ((cVar1 == ';') || (cVar1 == '\0')) {
        if (lablptr == (t_symbol *)0x0) {
          if ((lastlabl != (t_symbol *)0x0) && (lastlabl->data_type == 0)) {
            lastlabl->data_size = (loccnt - data_loccnt) + lastlabl->data_size;
          }
        }
        else {
          lablptr->data_type = 0;
          lablptr->data_size = loccnt - data_loccnt;
        }
        if (pass == 1) {
          println();
        }
      }
      else {
        error("Syntax error!");
      }
      return;
    }
  } while( true );
}

Assistant:

void
do_db(int *ip)
{
	unsigned char c;

	/* define label */
	labldef(loccnt, 1);

	/* output infos */
	data_loccnt = loccnt;
	data_level  = 2;

	/* skip spaces */
	while (isspace(prlnbuf[++(*ip)]));

	/* get bytes */
	for (;;) {
		/* ASCII string */
		if (prlnbuf[*ip] == '\"') {
			for (;;) {
				c = prlnbuf[++(*ip)];
				if (c == '\"')
					break;
				if (c == '\0') {
					error("Unterminated ASCII string!");
					return;
				}
				if (c == '\\') {
					c = prlnbuf[++(*ip)];
					switch(c) {
					case 'r':
						c = '\r';
						break;
					case 'n':
						c = '\n';
						break;
					case 't':
						c = '\t';
						break;
					}
				}
				/* store char on last pass */
				if (pass == LAST_PASS)
					putbyte(loccnt, c);

				/* update location counter */
				loccnt++;
			}
			(*ip)++;
		}
		/* bytes */
		else {
			/* get a byte */
			if (!evaluate(ip, 0))
				return;

			/* update location counter */
			loccnt++;

			/* store byte on last pass */
			if (pass == LAST_PASS) {
				/* check for overflow */
				if ((value > 0xFF) && (value < 0xFFFFFF80)) {
					error("Overflow error!");
					return;
				}

				/* store byte */
				putbyte(loccnt - 1, value);
			}
		}

		/* check if there's another byte */
		c = prlnbuf[(*ip)++];

		if (c != ',')
			break;
	}

	/* check error */
	if (c != ';' && c != '\0') {
		error("Syntax error!");
		return;
	}

	/* size */
	if (lablptr) {
		lablptr->data_type = P_DB;
		lablptr->data_size = loccnt - data_loccnt;
	}
	else {
		if (lastlabl) {
			if (lastlabl->data_type == P_DB)
				lastlabl->data_size += loccnt - data_loccnt;
		}
	}

	/* output line */
	if (pass == LAST_PASS)
		println();
}